

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall ON_Font::SetFontStretch(ON_Font *this,Stretch font_stretch)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->m_font_stretch != font_stretch) {
    bVar1 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2eb9);
    if (bVar1) {
      this->m_font_stretch = font_stretch;
      Internal_AfterModification(this);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_Font::SetFontStretch(
  ON_Font::Stretch font_stretch
  )
{
  if (m_font_stretch != font_stretch)
  {
    if ( false == ON_FONT_MODIFICATION_PERMITTED )
      return false;

    m_font_stretch = font_stretch;
    Internal_AfterModification();
  }
  return true;
}